

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassToObject
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  int iVar1;
  Descriptor *pDVar2;
  Printer *this_00;
  bool bVar3;
  uint uVar4;
  GeneratorOptions *options_00;
  string *value1;
  GeneratorOptions *descriptor;
  Descriptor *in_R8;
  string local_c8;
  string local_a8;
  string local_88;
  FieldDescriptor *local_68;
  FieldDescriptor *field;
  byte local_55;
  int i;
  bool first;
  string local_48;
  GeneratorOptions *local_28;
  Descriptor *desc_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_28 = (GeneratorOptions *)desc;
  desc_local = (Descriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  io::Printer::Print(printer,
                     "\n\nif (jspb.Message.GENERATE_TO_OBJECT) {\n/**\n * Creates an object representation of this proto suitable for use in Soy templates.\n * Field names that are reserved in JavaScript and will be renamed to pb_name.\n * To access a reserved field use, foo.pb_<name>, eg, foo.pb_default.\n * For the list of reserved names please see:\n *     com.google.apps.jspb.JsClassTemplate.JS_RESERVED_WORDS.\n * @param {boolean=} opt_includeInstance Whether to include the JSPB instance\n *     for transitional soy proto support: http://goto/soy-param-migration\n * @return {!Object}\n */\n$classname$.prototype.toObject = function(opt_includeInstance) {\n  return $classname$.toObject(opt_includeInstance, this);\n};\n\n\n/**\n * Static version of the {@see toObject} method.\n * @param {boolean|undefined} includeInstance Whether to include the JSPB\n *     instance for transitional soy proto support:\n *     http://goto/soy-param-migration\n * @param {!$classname$} msg The msg instance to transform.\n * @return {!Object}\n */\n$classname$.toObject = function(includeInstance, msg) {\n  var f, obj = {"
                     ,"classname",&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  local_55 = 1;
  field._4_4_ = 0;
  while( true ) {
    iVar1 = field._4_4_;
    uVar4 = Descriptor::field_count((Descriptor *)local_28);
    value1 = (string *)(ulong)uVar4;
    if ((int)uVar4 <= iVar1) break;
    local_68 = Descriptor::field((Descriptor *)local_28,field._4_4_);
    bVar3 = anon_unknown_0::IgnoreField(local_68);
    if (!bVar3) {
      if ((local_55 & 1) == 0) {
        io::Printer::Print((Printer *)desc_local,",\n    ");
      }
      else {
        io::Printer::Print((Printer *)desc_local,"\n    ");
        local_55 = 0;
      }
      GenerateClassFieldToObject
                (this,(GeneratorOptions *)printer_local,(Printer *)desc_local,local_68);
    }
    field._4_4_ = field._4_4_ + 1;
  }
  if ((local_55 & 1) == 0) {
    io::Printer::Print((Printer *)desc_local,"\n  };\n\n");
  }
  else {
    io::Printer::Print((Printer *)desc_local,"\n\n  };\n\n");
  }
  bVar3 = anon_unknown_0::IsExtendable((Descriptor *)local_28);
  this_00 = printer_local;
  pDVar2 = desc_local;
  if (bVar3) {
    options_00 = (GeneratorOptions *)Descriptor::file((Descriptor *)local_28);
    descriptor = local_28;
    (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
              (&local_88,(_anonymous_namespace_ *)this_00,options_00,(FileDescriptor *)local_28,
               in_R8);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_a8,(_anonymous_namespace_ *)printer_local,local_28,(Descriptor *)descriptor);
    value1 = &local_88;
    io::Printer::Print((Printer *)pDVar2,
                       "  jspb.Message.toObjectExtension(/** @type {!jspb.Message} */ (msg), obj,\n      $extObject$, $class$.prototype.getExtension,\n      includeInstance);\n"
                       ,"extObject",value1,"class",&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
  }
  pDVar2 = desc_local;
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_c8,(_anonymous_namespace_ *)printer_local,local_28,(Descriptor *)value1);
  io::Printer::Print((Printer *)pDVar2,
                     "  if (includeInstance) {\n    obj.$$jspbMessageInstance = msg;\n  }\n  return obj;\n};\n}\n\n\n"
                     ,"classname",&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void Generator::GenerateClassToObject(const GeneratorOptions& options,
                                      io::Printer* printer,
                                      const Descriptor* desc) const {
  printer->Print(
      "\n"
      "\n"
      "if (jspb.Message.GENERATE_TO_OBJECT) {\n"
      "/**\n"
      " * Creates an object representation of this proto suitable for use in "
      "Soy templates.\n"
      " * Field names that are reserved in JavaScript and will be renamed to "
      "pb_name.\n"
      " * To access a reserved field use, foo.pb_<name>, eg, foo.pb_default.\n"
      " * For the list of reserved names please see:\n"
      " *     com.google.apps.jspb.JsClassTemplate.JS_RESERVED_WORDS.\n"
      " * @param {boolean=} opt_includeInstance Whether to include the JSPB "
      "instance\n"
      " *     for transitional soy proto support: http://goto/soy-param-"
      "migration\n"
      " * @return {!Object}\n"
      " */\n"
      "$classname$.prototype.toObject = function(opt_includeInstance) {\n"
      "  return $classname$.toObject(opt_includeInstance, this);\n"
      "};\n"
      "\n"
      "\n"
      "/**\n"
      " * Static version of the {@see toObject} method.\n"
      " * @param {boolean|undefined} includeInstance Whether to include the "
      "JSPB\n"
      " *     instance for transitional soy proto support:\n"
      " *     http://goto/soy-param-migration\n"
      " * @param {!$classname$} msg The msg instance to transform.\n"
      " * @return {!Object}\n"
      " */\n"
      "$classname$.toObject = function(includeInstance, msg) {\n"
      "  var f, obj = {",
      "classname", GetMessagePath(options, desc));

  bool first = true;
  for (int i = 0; i < desc->field_count(); i++) {
    const FieldDescriptor* field = desc->field(i);
    if (IgnoreField(field)) {
      continue;
    }

    if (!first) {
      printer->Print(",\n    ");
    } else {
      printer->Print("\n    ");
      first = false;
    }

    GenerateClassFieldToObject(options, printer, field);
  }

  if (!first) {
    printer->Print("\n  };\n\n");
  } else {
    printer->Print("\n\n  };\n\n");
  }

  if (IsExtendable(desc)) {
    printer->Print(
        "  jspb.Message.toObjectExtension(/** @type {!jspb.Message} */ (msg), "
        "obj,\n"
        "      $extObject$, $class$.prototype.getExtension,\n"
        "      includeInstance);\n",
        "extObject", JSExtensionsObjectName(options, desc->file(), desc),
        "class", GetMessagePath(options, desc));
  }

  printer->Print(
      "  if (includeInstance) {\n"
      "    obj.$$jspbMessageInstance = msg;\n"
      "  }\n"
      "  return obj;\n"
      "};\n"
      "}\n"
      "\n"
      "\n",
      "classname", GetMessagePath(options, desc));
}